

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uint lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  uint ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1a;
  char local_19;
  uint local_18;
  uint local_14;
  
  local_1a.m_int = 0;
  local_18 = lhs;
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,&local_1a);
  if (bVar1) {
    local_14 = (uint)(byte)local_1a.m_int;
  }
  else {
    local_14 = 0;
    local_19 = rhs.m_int;
    DivisionHelper<unsigned_int,_signed_char,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_18,&local_19,&local_14)
    ;
    if (0x7f < local_14) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)(char)local_14;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}